

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat.cpp
# Opt level: O1

void ncnn::resize_bilinear(Mat *src,Mat *dst,int w,int h)

{
  uint uVar1;
  int *piVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  void *pvVar6;
  void *pvVar7;
  size_t sVar8;
  ulong uVar9;
  long lVar10;
  undefined1 auVar11 [16];
  Mat resizem;
  Mat m;
  Mat local_98;
  Mat local_68;
  ulong local_38;
  
  if ((src->w == w) && (src->h == h)) {
    if (dst != src) {
      piVar2 = src->refcount;
      if (piVar2 != (int *)0x0) {
        LOCK();
        *piVar2 = *piVar2 + 1;
        UNLOCK();
      }
      piVar2 = dst->refcount;
      if (piVar2 != (int *)0x0) {
        LOCK();
        *piVar2 = *piVar2 + -1;
        UNLOCK();
        if ((*piVar2 == 0) && (dst->data != (void *)0x0)) {
          free(*(void **)((long)dst->data + -8));
        }
      }
      dst->h = 0;
      dst->c = 0;
      dst->cstep = 0;
      dst->elemsize = 0;
      dst->dims = 0;
      dst->w = 0;
      dst->data = (void *)0x0;
      dst->refcount = (int *)0x0;
      piVar2 = src->refcount;
      dst->data = src->data;
      dst->refcount = piVar2;
      dst->elemsize = src->elemsize;
      iVar5 = src->w;
      iVar3 = src->h;
      iVar4 = src->c;
      dst->dims = src->dims;
      dst->w = iVar5;
      dst->h = iVar3;
      dst->c = iVar4;
      dst->cstep = src->cstep;
    }
  }
  else if (src->dims == 3) {
    uVar1 = src->c;
    auVar11._0_4_ = -(uint)(dst->dims == 3);
    auVar11._4_4_ = -(uint)(w == dst->w);
    auVar11._8_4_ = -(uint)(h == dst->h);
    auVar11._12_4_ = -(uint)(uVar1 == dst->c);
    iVar5 = movmskps(3,auVar11);
    if ((iVar5 != 0xf) || (dst->elemsize != 4)) {
      piVar2 = dst->refcount;
      if (piVar2 != (int *)0x0) {
        LOCK();
        *piVar2 = *piVar2 + -1;
        UNLOCK();
        if ((*piVar2 == 0) && (dst->data != (void *)0x0)) {
          free(*(void **)((long)dst->data + -8));
        }
      }
      dst->elemsize = 0;
      dst->dims = 0;
      dst->w = 0;
      dst->h = 0;
      dst->c = 0;
      dst->cstep = 0;
      dst->data = (void *)0x0;
      dst->refcount = (int *)0x0;
      dst->elemsize = 4;
      dst->dims = 3;
      dst->w = w;
      dst->h = h;
      dst->c = uVar1;
      uVar9 = (long)(h * w) + 3U & 0x3ffffffffffffffc;
      dst->cstep = uVar9;
      lVar10 = uVar9 * (long)(int)uVar1;
      if (lVar10 != 0) {
        pvVar6 = malloc(lVar10 * 4 + 0x1c);
        pvVar7 = (void *)((long)pvVar6 + 0x17U & 0xfffffffffffffff0);
        *(void **)((long)pvVar7 - 8) = pvVar6;
        dst->data = pvVar7;
        piVar2 = (int *)((long)pvVar7 + lVar10 * 4);
        dst->refcount = piVar2;
        *piVar2 = 1;
      }
    }
    if ((dst->data != (void *)0x0) && (0 < (int)uVar1 && (long)dst->c * dst->cstep != 0)) {
      local_38 = (ulong)uVar1;
      uVar9 = 0;
      do {
        local_68.w = src->w;
        local_68.h = src->h;
        local_68.elemsize = src->elemsize;
        local_68.data = (void *)(src->cstep * uVar9 * local_68.elemsize + (long)src->data);
        local_68.refcount = (int *)0x0;
        local_68.dims = 2;
        local_68.c = 1;
        local_68.cstep = (size_t)(local_68.h * local_68.w);
        local_98.w = dst->w;
        local_98.h = dst->h;
        local_98.elemsize = dst->elemsize;
        local_98.data = (void *)(dst->cstep * uVar9 * local_98.elemsize + (long)dst->data);
        local_98.refcount = (int *)0x0;
        local_98.dims = 2;
        local_98.c = 1;
        local_98.cstep = (size_t)(local_98.h * local_98.w);
        resize_bilinear_image(&local_68,&local_98,w,h);
        if (local_98.refcount != (int *)0x0) {
          LOCK();
          *local_98.refcount = *local_98.refcount + -1;
          UNLOCK();
          if ((*local_98.refcount == 0) && (local_98.data != (void *)0x0)) {
            free(*(void **)((long)local_98.data + -8));
          }
        }
        if (local_68.refcount != (int *)0x0) {
          LOCK();
          *local_68.refcount = *local_68.refcount + -1;
          UNLOCK();
          if ((*local_68.refcount == 0) && (local_68.data != (void *)0x0)) {
            free(*(void **)((long)local_68.data + -8));
          }
        }
        uVar9 = uVar9 + 1;
      } while (local_38 != uVar9);
    }
  }
  else if (src->dims == 2) {
    if ((((dst->dims != 2) || (dst->w != w)) || (dst->h != h)) || (dst->elemsize != 4)) {
      piVar2 = dst->refcount;
      if (piVar2 != (int *)0x0) {
        LOCK();
        *piVar2 = *piVar2 + -1;
        UNLOCK();
        if ((*piVar2 == 0) && (dst->data != (void *)0x0)) {
          free(*(void **)((long)dst->data + -8));
        }
      }
      dst->elemsize = 0;
      dst->dims = 0;
      dst->w = 0;
      dst->h = 0;
      dst->c = 0;
      dst->cstep = 0;
      dst->data = (void *)0x0;
      dst->refcount = (int *)0x0;
      dst->elemsize = 4;
      dst->dims = 2;
      dst->w = w;
      dst->h = h;
      dst->c = 1;
      sVar8 = (size_t)(h * w);
      dst->cstep = sVar8;
      if (h * w != 0) {
        pvVar6 = malloc(sVar8 * 4 + 0x1c);
        pvVar7 = (void *)((long)pvVar6 + 0x17U & 0xfffffffffffffff0);
        *(void **)((long)pvVar7 - 8) = pvVar6;
        dst->data = pvVar7;
        piVar2 = (int *)((long)pvVar7 + sVar8 * 4);
        dst->refcount = piVar2;
        *piVar2 = 1;
      }
    }
    if ((dst->data != (void *)0x0) && ((long)dst->c * dst->cstep != 0)) {
      resize_bilinear_image(src,dst,w,h);
      return;
    }
  }
  return;
}

Assistant:

void resize_bilinear(const Mat& src, Mat& dst, int w, int h)
{
    if (w == src.w && h == src.h)
    {
        dst = src;
        return;
    }

    if (src.dims == 2)
    {
        dst.create(w, h);
        if (dst.empty())
            return;

        resize_bilinear_image(src, dst, w, h);
    }
    else if (src.dims == 3)
    {
        int channels = src.c;

        dst.create(w, h, channels);
        if (dst.empty())
            return;

        // unroll image channel
        #pragma omp parallel for
        for (int q=0; q<channels; q++)
        {
            const Mat m = src.channel(q);
            Mat resizem = dst.channel(q);

            resize_bilinear_image(m, resizem, w, h);
        }
    }
}